

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::StandardPageSizesTestCase::StandardPageSizesTestCase
          (StandardPageSizesTestCase *this,Context *context)

{
  _Rb_tree_header *p_Var1;
  
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"StandardPageSizesTestCase",
             "Verifies if values returned by GetInternalFormativ query matches Standard Virtual Page Sizes"
            );
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StandardPageSizesTestCase_020e2450;
  (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->mStandardVirtualPageSizesTable)._M_t._M_impl.super__Rb_tree_header;
  (this->mStandardVirtualPageSizesTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->mStandardVirtualPageSizesTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->mStandardVirtualPageSizesTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->mStandardVirtualPageSizesTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->mStandardVirtualPageSizesTable)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

StandardPageSizesTestCase::StandardPageSizesTestCase(deqp::Context& context)
	: TestCase(context, "StandardPageSizesTestCase",
			   "Verifies if values returned by GetInternalFormativ query matches Standard Virtual Page Sizes")
{
	/* Left blank intentionally */
}